

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O1

void Gia_ManPrepareLastTwo(Gia_Man_t *pNew,Vec_Int_t *vSuper)

{
  uint iLit0;
  uint iLit1;
  Vec_Int_t *pVVar1;
  int *piVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  uint local_5c;
  long local_48;
  ulong uVar7;
  
  iVar9 = vSuper->nSize;
  if (iVar9 != 2) {
    if (iVar9 < 3) {
      __assert_fail("nSize > 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                    ,0xe8,"void Gia_ManPrepareLastTwo(Gia_Man_t *, Vec_Int_t *)");
    }
    uVar8 = iVar9 - 2;
    if (vSuper->pArray[uVar8] < 0) {
LAB_0067af9e:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                    ,0xf2,"int Abc_Lit2Var(int)");
    }
    uVar13 = (uint)vSuper->pArray[uVar8] >> 1;
    pVVar1 = pNew->vLevels;
    Vec_IntFillExtra(pVVar1,uVar13 + 1,0);
    if (pVVar1->nSize <= (int)uVar13) {
LAB_0067af7f:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                    ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    iVar6 = pVVar1->pArray[uVar13];
    uVar13 = iVar9 - 3U;
    do {
      if (vSuper->nSize <= (int)uVar13) goto LAB_0067af7f;
      if (vSuper->pArray[uVar13] < 0) goto LAB_0067af9e;
      uVar11 = (uint)vSuper->pArray[uVar13] >> 1;
      pVVar1 = pNew->vLevels;
      Vec_IntFillExtra(pVVar1,uVar11 + 1,0);
      if (pVVar1->nSize <= (int)uVar11) goto LAB_0067af7f;
      if (iVar6 != pVVar1->pArray[uVar11]) goto LAB_0067ae41;
      bVar3 = 0 < (int)uVar13;
      uVar13 = uVar13 - 1;
    } while (bVar3);
    uVar13 = 0xffffffff;
LAB_0067ae41:
    if (uVar13 != iVar9 - 3U) {
      uVar11 = iVar9 - 9U;
      if ((int)(iVar9 - 9U) < (int)uVar13) {
        uVar11 = uVar13;
      }
      uVar4 = iVar9 - 1;
      uVar7 = (ulong)uVar4;
      if ((int)uVar13 < (int)uVar4) {
        local_48 = 0;
        uVar12 = uVar7;
        local_5c = uVar8;
        do {
          uVar13 = (uint)uVar12;
          uVar5 = uVar13 - 1;
          if ((int)uVar11 < (int)uVar5) {
            if ((int)uVar13 < 0) goto LAB_0067af7f;
            lVar14 = (long)(int)local_5c;
            uVar10 = uVar12;
            lVar15 = local_48;
            do {
              if (((vSuper->nSize <= (int)uVar13) || (iVar9 = (int)uVar10, iVar9 < 1)) ||
                 (vSuper->nSize < iVar9)) goto LAB_0067af7f;
              iLit0 = vSuper->pArray[uVar12];
              if (((int)iLit0 < 0) || (iLit1 = vSuper->pArray[lVar14], (int)iLit1 < 0))
              goto LAB_0067af9e;
              if ((iLit1 ^ iLit0) < 2) {
LAB_0067af0f:
                piVar2 = vSuper->pArray;
                if (uVar13 != uVar4) {
                  iVar6 = piVar2[uVar12];
                  piVar2[uVar12] = piVar2[uVar7];
                  piVar2[uVar7] = iVar6;
                }
                if (lVar15 != 0) {
                  iVar6 = piVar2[lVar14];
                  piVar2[lVar14] = piVar2[uVar8];
                  piVar2[uVar8] = iVar6;
                }
              }
              else {
                iVar6 = Gia_ManHashLookupInt(pNew,iLit0,iLit1);
                if (iVar6 != 0) goto LAB_0067af0f;
              }
              lVar14 = lVar14 + -1;
              lVar15 = lVar15 + 1;
              uVar10 = (ulong)(iVar9 - 1);
            } while ((int)uVar11 < lVar14);
          }
          local_5c = local_5c - 1;
          local_48 = local_48 + 1;
          uVar12 = (ulong)uVar5;
        } while ((int)uVar11 < (int)uVar5);
      }
    }
  }
  return;
}

Assistant:

void Gia_ManPrepareLastTwo( Gia_Man_t * pNew, Vec_Int_t * vSuper )
{
    int i, k, Stop, Lit1, Lit2, Level1, Level2, * pArray;
    int nSize = Vec_IntSize(vSuper);
    if ( nSize == 2 )
        return;
    assert( nSize > 2 );
    Level1 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, nSize-2)) );
    // find the first one with Level1
    for ( Stop = nSize-3; Stop >= 0; Stop-- )
    {
        Level2 = Gia_ObjLevelId( pNew, Abc_Lit2Var(Vec_IntEntry(vSuper, Stop)) );
        if ( Level1 != Level2 )
            break;
    }
    if ( Stop == nSize-3 )
        return;
    // avoid worst-case quadratic behavior by looking at the last 8 nodes
    Stop = Abc_MaxInt( Stop, nSize - 9 );
    for ( i = nSize - 1; i > Stop; i-- )
        for ( k = i - 1; k > Stop; k-- )
        {
            Lit1 = Vec_IntEntry(vSuper, i);
            Lit2 = Vec_IntEntry(vSuper, k);
            if ( Abc_Lit2Var(Lit1) != Abc_Lit2Var(Lit2) && !Gia_ManHashLookupInt(pNew, Lit1, Lit2) ) // new node
                continue;
            // move Lit1 to be last and Lit2 to be the one before
            pArray = Vec_IntArray( vSuper );
            if ( i != nSize-1 )
                ABC_SWAP( int, pArray[i], pArray[nSize-1] );
            if ( k != nSize-2 )
                ABC_SWAP( int, pArray[k], pArray[nSize-2] );
        }
}